

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this)

{
  uint __tmp;
  uint uVar1;
  undefined1 auVar2 [16];
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  
  uVar1 = Pop<unsigned_int>(this);
  auVar2 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0);
  value.v._8_8_ = auVar2._0_8_;
  value.v[0] = (short)value.v._8_8_;
  value.v[1] = (short)((ulong)value.v._8_8_ >> 0x10);
  value.v[2] = (short)((ulong)value.v._8_8_ >> 0x20);
  value.v[3] = (short)((ulong)value.v._8_8_ >> 0x30);
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}